

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aiman.h
# Opt level: O0

void server::aiman::balanceteams(void)

{
  clientinfo *pcVar1;
  bool bVar2;
  int iVar3;
  clientinfo **ppcVar4;
  teamscore *ptVar5;
  teamscore *ptVar6;
  teamscore *b;
  int local_58;
  int local_54;
  int j;
  int i_1;
  clientinfo *bot;
  teamscore *t;
  undefined1 local_38 [4];
  int i;
  vector<server::clientinfo_*> reassign;
  undefined1 local_18 [8];
  vector<teamscore> teams;
  
  vector<teamscore>::vector((vector<teamscore> *)local_18);
  calcteams((vector<teamscore> *)local_18);
  vector<server::clientinfo_*>::vector((vector<server::clientinfo_*> *)local_38);
  for (t._4_4_ = 0;
      iVar3 = vector<server::clientinfo_*>::length((vector<server::clientinfo_*> *)bots),
      t._4_4_ < iVar3; t._4_4_ = t._4_4_ + 1) {
    ppcVar4 = vector<server::clientinfo_*>::operator[]((vector<server::clientinfo_*> *)bots,t._4_4_)
    ;
    if (*ppcVar4 != (clientinfo *)0x0) {
      ppcVar4 = vector<server::clientinfo_*>::operator[]
                          ((vector<server::clientinfo_*> *)bots,t._4_4_);
      vector<server::clientinfo_*>::add((vector<server::clientinfo_*> *)local_38,ppcVar4);
    }
  }
  do {
    iVar3 = vector<server::clientinfo_*>::length((vector<server::clientinfo_*> *)local_38);
    bVar2 = false;
    if (iVar3 != 0) {
      iVar3 = vector<teamscore>::length((vector<teamscore> *)local_18);
      bVar2 = false;
      if (iVar3 != 0) {
        ptVar5 = vector<teamscore>::operator[]((vector<teamscore> *)local_18,0);
        iVar3 = ptVar5->score;
        ptVar5 = vector<teamscore>::last((vector<teamscore> *)local_18);
        bVar2 = ptVar5->score + 1 < iVar3;
      }
    }
    if (!bVar2) {
      vector<server::clientinfo_*>::~vector((vector<server::clientinfo_*> *)local_38);
      vector<teamscore>::~vector((vector<teamscore> *)local_18);
      return;
    }
    ptVar5 = vector<teamscore>::last((vector<teamscore> *)local_18);
    _j = (clientinfo *)0x0;
    for (local_54 = 0;
        iVar3 = vector<server::clientinfo_*>::length((vector<server::clientinfo_*> *)local_38),
        local_54 < iVar3; local_54 = local_54 + 1) {
      ppcVar4 = vector<server::clientinfo_*>::operator[]
                          ((vector<server::clientinfo_*> *)local_38,local_54);
      if (*ppcVar4 != (clientinfo *)0x0) {
        ppcVar4 = vector<server::clientinfo_*>::operator[]
                            ((vector<server::clientinfo_*> *)local_38,local_54);
        pcVar1 = *ppcVar4;
        ptVar6 = vector<teamscore>::operator[]((vector<teamscore> *)local_18,0);
        iVar3 = strcmp(pcVar1->team,ptVar6->team);
        if (iVar3 == 0) {
          _j = vector<server::clientinfo_*>::removeunordered
                         ((vector<server::clientinfo_*> *)local_38,local_54);
          ptVar6 = vector<teamscore>::operator[]((vector<teamscore> *)local_18,0);
          ptVar6->score = ptVar6->score + -1;
          ptVar5->score = ptVar5->score + 1;
          local_58 = vector<teamscore>::length((vector<teamscore> *)local_18);
          local_58 = local_58 + -2;
          goto LAB_0016593a;
        }
      }
    }
LAB_001659f7:
    if (_j == (clientinfo *)0x0) {
      vector<teamscore>::remove((vector<teamscore> *)local_18,(char *)0x0);
    }
    else {
      if ((smode != (long *)0x0) && ((_j->state).state == 0)) {
        (**(code **)(*smode + 0x50))(smode,_j,_j->team,ptVar5->team);
      }
      copystring(_j->team,ptVar5->team,5);
      sendf(-1,1,"riisi",0x40,(ulong)(uint)_j->clientnum,_j->team,0);
    }
  } while( true );
LAB_0016593a:
  if (local_58 < 0) goto LAB_001659f7;
  ptVar6 = vector<teamscore>::operator[]((vector<teamscore> *)local_18,local_58);
  iVar3 = ptVar6->score;
  ptVar6 = vector<teamscore>::operator[]((vector<teamscore> *)local_18,local_58 + 1);
  if (ptVar6->score <= iVar3) goto LAB_001659f7;
  ptVar6 = vector<teamscore>::operator[]((vector<teamscore> *)local_18,local_58);
  b = vector<teamscore>::operator[]((vector<teamscore> *)local_18,local_58 + 1);
  swap<teamscore>(ptVar6,b);
  local_58 = local_58 + -1;
  goto LAB_0016593a;
}

Assistant:

void balanceteams()
    {
        vector<teamscore> teams;
        calcteams(teams);
        vector<clientinfo *> reassign;
        loopv(bots) if(bots[i]) reassign.add(bots[i]);
        while(reassign.length() && teams.length() && teams[0].score > teams.last().score + 1)
        {
            teamscore &t = teams.last();
            clientinfo *bot = NULL;
            loopv(reassign) if(reassign[i] && !strcmp(reassign[i]->team, teams[0].team))
            {
                bot = reassign.removeunordered(i);
                teams[0].score--;
                t.score++;
                for(int j = teams.length() - 2; j >= 0; j--)
                {
                    if(teams[j].score >= teams[j+1].score) break;
                    swap(teams[j], teams[j+1]);
                }
                break;
            }
            if(bot)
            {
                if(smode && bot->state.state==CS_ALIVE) smode->changeteam(bot, bot->team, t.team);
                copystring(bot->team, t.team, MAXTEAMLEN+1);
                sendf(-1, 1, "riisi", N_SETTEAM, bot->clientnum, bot->team, 0);
            }
            else teams.remove(0, 1);
        }
    }